

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker_kernel_1.cpp
# Opt level: O0

void __thiscall dlib::linker::linker(linker *this)

{
  mutex *in_RDI;
  signaler *unaff_retaddr;
  mutex *assoc_mutex;
  
  (in_RDI->myMutex).__align = (long)&PTR__linker_005560a0;
  (in_RDI->myMutex).__size[8] = '\0';
  assoc_mutex = in_RDI;
  mutex::mutex((mutex *)unaff_retaddr);
  signaler::signaler(unaff_retaddr,assoc_mutex);
  in_RDI[3].myMutex.__align = 0;
  *(undefined8 *)((long)&in_RDI[3].myMutex + 8) = 0;
  mutex::mutex((mutex *)unaff_retaddr);
  mutex::mutex((mutex *)unaff_retaddr);
  signaler::signaler(unaff_retaddr,assoc_mutex);
  mutex::mutex((mutex *)unaff_retaddr);
  return;
}

Assistant:

linker::
    linker (
    ) :
        running(false),
        running_signaler(running_mutex),
        A(0),
        B(0),
        service_connection_running_signaler(service_connection_running_mutex)
    {
    }